

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

bool __thiscall
arealights::Application::onMouseButton(Application *this,int button,int action,int mods)

{
  bool bVar1;
  element_type *peVar2;
  int mods_local;
  int action_local;
  int button_local;
  Application *this_local;
  
  bVar1 = fw::ImGuiApplication::onMouseButton(&this->super_ImGuiApplication,button,action,mods);
  if (!bVar1) {
    if (action == 1) {
      peVar2 = std::
               __shared_ptr_access<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_mouseInput);
      fw::GenericMouseInput::buttonDown(peVar2,button);
    }
    else if (action == 0) {
      peVar2 = std::
               __shared_ptr_access<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_mouseInput);
      fw::GenericMouseInput::buttonUp(peVar2,button);
    }
  }
  return true;
}

Assistant:

bool Application::onMouseButton(int button, int action, int mods)
{
    if (ImGuiApplication::onMouseButton(button, action, mods)) { return true; }

    if (action == GLFW_PRESS)
    {
        _mouseInput->buttonDown(button);
    }
    else if (action == GLFW_RELEASE)
    {
        _mouseInput->buttonUp(button);
    }

    return true;
}